

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encodeframe.c
# Opt level: O3

void free_block_hash_buffers(uint32_t *(*block_hash_values) [2],int8_t *(*is_block_same) [3])

{
  bool bVar1;
  bool bVar2;
  long lVar3;
  long lVar4;
  
  lVar4 = 0;
  bVar1 = true;
  do {
    bVar2 = bVar1;
    aom_free(block_hash_values[lVar4][0]);
    aom_free(block_hash_values[lVar4][1]);
    lVar3 = 0;
    do {
      aom_free(is_block_same[lVar4][lVar3]);
      lVar3 = lVar3 + 1;
    } while (lVar3 != 3);
    lVar4 = 1;
    bVar1 = false;
  } while (bVar2);
  return;
}

Assistant:

static void free_block_hash_buffers(uint32_t *block_hash_values[2][2],
                                    int8_t *is_block_same[2][3]) {
  for (int k = 0; k < 2; ++k) {
    for (int j = 0; j < 2; ++j) {
      aom_free(block_hash_values[k][j]);
    }

    for (int j = 0; j < 3; ++j) {
      aom_free(is_block_same[k][j]);
    }
  }
}